

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

bool rapidjson::Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
     Transcode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
               (GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
               GenericInsituStringStream<rapidjson::UTF8<char>_> *os)

{
  Ch CVar1;
  Ch *pCVar2;
  Ch *pCVar3;
  
  pCVar2 = is->src_;
  is->src_ = pCVar2 + 1;
  pCVar3 = os->dst_;
  if (pCVar3 != (Ch *)0x0) {
    CVar1 = *pCVar2;
    os->dst_ = pCVar3 + 1;
    *pCVar3 = CVar1;
    return true;
  }
  __assert_fail("dst_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/stream.h"
                ,0x9b,
                "void rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>::Put(Ch) [Encoding = rapidjson::UTF8<>]"
               );
}

Assistant:

Ch Take() { return *src_++; }